

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void LoadOpenGLFunctions(void)

{
  int iVar1;
  openglfn_glBlitFramebuffer_t local_378;
  openglfn_glFramebufferRenderbuffer_t local_370;
  openglfn_glCheckFramebufferStatus_t local_368;
  openglfn_glGenFramebuffers_t local_360;
  openglfn_glDeleteFramebuffers_t local_358;
  openglfn_glBindFramebuffer_t local_350;
  openglfn_glIsFramebuffer_t local_348;
  openglfn_glGetRenderbufferParameteriv_t local_340;
  openglfn_glRenderbufferStorageMultisample_t local_338;
  openglfn_glRenderbufferStorage_t local_330;
  openglfn_glGenRenderbuffers_t local_328;
  openglfn_glDeleteRenderbuffers_t local_320;
  openglfn_glBindRenderbuffer_t local_318;
  openglfn_glTexCoord2f_t local_310;
  openglfn_glVertex2i_t local_308;
  openglfn_glTexSubImage2D_t local_300;
  openglfn_glTexImage2D_t local_2f8;
  openglfn_glOrtho_t local_2f0;
  openglfn_glPushMatrix_t local_2e8;
  openglfn_glLoadIdentity_t local_2e0;
  openglfn_glMatrixMode_t local_2d8;
  openglfn_glColor4f_t local_2d0;
  openglfn_glBlendFunc_t local_2c8;
  openglfn_glPixelStorei_t local_2c0;
  openglfn_glTexParameteri_t local_2b8;
  openglfn_glTexEnvf_t local_2b0;
  openglfn_glEnd_t local_2a8;
  openglfn_glBindTexture_t local_2a0;
  openglfn_glPushClientAttrib_t local_298;
  openglfn_glPushAttrib_t local_290;
  openglfn_glBegin_t local_288;
  openglfn_glPopMatrix_t local_280;
  openglfn_glPopClientAttrib_t local_278;
  openglfn_glPopAttrib_t local_270;
  openglfn_glGenTextures_t local_268;
  openglfn_glDeleteTextures_t local_260;
  openglfn_glCopyTexSubImage3D_t local_258;
  openglfn_glCopyTexSubImage2D_t local_250;
  openglfn_glCopyTexImage2D_t local_248;
  openglfn_glCopyTexSubImage1D_t local_240;
  openglfn_glCopyTexImage1D_t local_238;
  openglfn_glCopyPixels_t local_230;
  openglfn_glReadPixels_t local_228;
  openglfn_glScissor_t local_220;
  openglfn_glViewport_t local_218;
  openglfn_glClearColor_t local_210;
  openglfn_glGetIntegerv_t local_208;
  openglfn_glGetFloatv_t local_200;
  openglfn_glDisable_t local_1f8;
  openglfn_glEnable_t local_1f0;
  openglfn_glIsEnabled_t local_1e8;
  openglfn_glClear_t local_1e0;
  openglfn_glGetError_t local_1d8;
  openglfn_glGetString_t local_1d0;
  openglfn_glBlitFramebuffer_t local_1c8;
  openglfn_glFramebufferRenderbuffer_t local_1c0;
  openglfn_glCheckFramebufferStatus_t local_1b8;
  openglfn_glGenFramebuffers_t local_1b0;
  openglfn_glDeleteFramebuffers_t local_1a8;
  openglfn_glBindFramebuffer_t local_1a0;
  openglfn_glIsFramebuffer_t local_198;
  openglfn_glGetRenderbufferParameteriv_t local_190;
  openglfn_glRenderbufferStorageMultisample_t local_188;
  openglfn_glRenderbufferStorage_t local_180;
  openglfn_glGenRenderbuffers_t local_178;
  openglfn_glDeleteRenderbuffers_t local_170;
  openglfn_glBindRenderbuffer_t local_168;
  openglfn_glTexCoord2f_t local_160;
  openglfn_glVertex2i_t local_158;
  openglfn_glTexSubImage2D_t local_150;
  openglfn_glTexImage2D_t local_148;
  openglfn_glOrtho_t local_140;
  openglfn_glPushMatrix_t local_138;
  openglfn_glLoadIdentity_t local_130;
  openglfn_glMatrixMode_t local_128;
  openglfn_glColor4f_t local_120;
  openglfn_glBlendFunc_t local_118;
  openglfn_glPixelStorei_t local_110;
  openglfn_glTexParameteri_t local_108;
  openglfn_glTexEnvf_t local_100;
  openglfn_glEnd_t local_f8;
  openglfn_glBindTexture_t local_f0;
  openglfn_glPushClientAttrib_t local_e8;
  openglfn_glPushAttrib_t local_e0;
  openglfn_glBegin_t local_d8;
  openglfn_glPopMatrix_t local_d0;
  openglfn_glPopClientAttrib_t local_c8;
  openglfn_glPopAttrib_t local_c0;
  openglfn_glGenTextures_t local_b8;
  openglfn_glDeleteTextures_t local_b0;
  openglfn_glCopyTexSubImage3D_t local_a8;
  openglfn_glCopyTexSubImage2D_t local_a0;
  openglfn_glCopyTexImage2D_t local_98;
  openglfn_glCopyTexSubImage1D_t local_90;
  openglfn_glCopyTexImage1D_t local_88;
  openglfn_glCopyPixels_t local_80;
  openglfn_glReadPixels_t local_78;
  openglfn_glScissor_t local_70;
  openglfn_glViewport_t local_68;
  openglfn_glClearColor_t local_60;
  openglfn_glGetIntegerv_t local_58;
  openglfn_glGetFloatv_t local_50;
  openglfn_glDisable_t local_48;
  openglfn_glEnable_t local_40;
  openglfn_glIsEnabled_t local_38;
  openglfn_glClear_t local_30;
  openglfn_glGetError_t local_28;
  undefined4 local_18;
  int local_14;
  int minor;
  int major;
  char *version;
  
  local_14 = 0;
  local_18 = 0;
  (*SDL20_memset)(&OpenGLFuncs,0,0x1c0);
  OpenGLFuncs.SUPPORTS_Core = SDL_TRUE;
  OpenGLFuncs.glGetString = (openglfn_glGetString_t)(*SDL20_GL_GetProcAddress)("glGetString");
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_28 = (openglfn_glGetError_t)0x0;
  }
  else {
    local_28 = (openglfn_glGetError_t)(*SDL20_GL_GetProcAddress)("glGetError");
  }
  OpenGLFuncs.glGetError = local_28;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_30 = (openglfn_glClear_t)0x0;
  }
  else {
    local_30 = (openglfn_glClear_t)(*SDL20_GL_GetProcAddress)("glClear");
  }
  OpenGLFuncs.glClear = local_30;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_38 = (openglfn_glIsEnabled_t)0x0;
  }
  else {
    local_38 = (openglfn_glIsEnabled_t)(*SDL20_GL_GetProcAddress)("glIsEnabled");
  }
  OpenGLFuncs.glIsEnabled = local_38;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_40 = (openglfn_glEnable_t)0x0;
  }
  else {
    local_40 = (openglfn_glEnable_t)(*SDL20_GL_GetProcAddress)("glEnable");
  }
  OpenGLFuncs.glEnable = local_40;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_48 = (openglfn_glDisable_t)0x0;
  }
  else {
    local_48 = (openglfn_glDisable_t)(*SDL20_GL_GetProcAddress)("glDisable");
  }
  OpenGLFuncs.glDisable = local_48;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_50 = (openglfn_glGetFloatv_t)0x0;
  }
  else {
    local_50 = (openglfn_glGetFloatv_t)(*SDL20_GL_GetProcAddress)("glGetFloatv");
  }
  OpenGLFuncs.glGetFloatv = local_50;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_58 = (openglfn_glGetIntegerv_t)0x0;
  }
  else {
    local_58 = (openglfn_glGetIntegerv_t)(*SDL20_GL_GetProcAddress)("glGetIntegerv");
  }
  OpenGLFuncs.glGetIntegerv = local_58;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_60 = (openglfn_glClearColor_t)0x0;
  }
  else {
    local_60 = (openglfn_glClearColor_t)(*SDL20_GL_GetProcAddress)("glClearColor");
  }
  OpenGLFuncs.glClearColor = local_60;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_68 = (openglfn_glViewport_t)0x0;
  }
  else {
    local_68 = (openglfn_glViewport_t)(*SDL20_GL_GetProcAddress)("glViewport");
  }
  OpenGLFuncs.glViewport = local_68;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_70 = (openglfn_glScissor_t)0x0;
  }
  else {
    local_70 = (openglfn_glScissor_t)(*SDL20_GL_GetProcAddress)("glScissor");
  }
  OpenGLFuncs.glScissor = local_70;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_78 = (openglfn_glReadPixels_t)0x0;
  }
  else {
    local_78 = (openglfn_glReadPixels_t)(*SDL20_GL_GetProcAddress)("glReadPixels");
  }
  OpenGLFuncs.glReadPixels = local_78;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_80 = (openglfn_glCopyPixels_t)0x0;
  }
  else {
    local_80 = (openglfn_glCopyPixels_t)(*SDL20_GL_GetProcAddress)("glCopyPixels");
  }
  OpenGLFuncs.glCopyPixels = local_80;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_88 = (openglfn_glCopyTexImage1D_t)0x0;
  }
  else {
    local_88 = (openglfn_glCopyTexImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage1D");
  }
  OpenGLFuncs.glCopyTexImage1D = local_88;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_90 = (openglfn_glCopyTexSubImage1D_t)0x0;
  }
  else {
    local_90 = (openglfn_glCopyTexSubImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage1D");
  }
  OpenGLFuncs.glCopyTexSubImage1D = local_90;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_98 = (openglfn_glCopyTexImage2D_t)0x0;
  }
  else {
    local_98 = (openglfn_glCopyTexImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage2D");
  }
  OpenGLFuncs.glCopyTexImage2D = local_98;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_a0 = (openglfn_glCopyTexSubImage2D_t)0x0;
  }
  else {
    local_a0 = (openglfn_glCopyTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage2D");
  }
  OpenGLFuncs.glCopyTexSubImage2D = local_a0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_a8 = (openglfn_glCopyTexSubImage3D_t)0x0;
  }
  else {
    local_a8 = (openglfn_glCopyTexSubImage3D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage3D");
  }
  OpenGLFuncs.glCopyTexSubImage3D = local_a8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_b0 = (openglfn_glDeleteTextures_t)0x0;
  }
  else {
    local_b0 = (openglfn_glDeleteTextures_t)(*SDL20_GL_GetProcAddress)("glDeleteTextures");
  }
  OpenGLFuncs.glDeleteTextures = local_b0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_b8 = (openglfn_glGenTextures_t)0x0;
  }
  else {
    local_b8 = (openglfn_glGenTextures_t)(*SDL20_GL_GetProcAddress)("glGenTextures");
  }
  OpenGLFuncs.glGenTextures = local_b8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_c0 = (openglfn_glPopAttrib_t)0x0;
  }
  else {
    local_c0 = (openglfn_glPopAttrib_t)(*SDL20_GL_GetProcAddress)("glPopAttrib");
  }
  OpenGLFuncs.glPopAttrib = local_c0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_c8 = (openglfn_glPopClientAttrib_t)0x0;
  }
  else {
    local_c8 = (openglfn_glPopClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPopClientAttrib");
  }
  OpenGLFuncs.glPopClientAttrib = local_c8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_d0 = (openglfn_glPopMatrix_t)0x0;
  }
  else {
    local_d0 = (openglfn_glPopMatrix_t)(*SDL20_GL_GetProcAddress)("glPopMatrix");
  }
  OpenGLFuncs.glPopMatrix = local_d0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_d8 = (openglfn_glBegin_t)0x0;
  }
  else {
    local_d8 = (openglfn_glBegin_t)(*SDL20_GL_GetProcAddress)("glBegin");
  }
  OpenGLFuncs.glBegin = local_d8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_e0 = (openglfn_glPushAttrib_t)0x0;
  }
  else {
    local_e0 = (openglfn_glPushAttrib_t)(*SDL20_GL_GetProcAddress)("glPushAttrib");
  }
  OpenGLFuncs.glPushAttrib = local_e0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_e8 = (openglfn_glPushClientAttrib_t)0x0;
  }
  else {
    local_e8 = (openglfn_glPushClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPushClientAttrib");
  }
  OpenGLFuncs.glPushClientAttrib = local_e8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_f0 = (openglfn_glBindTexture_t)0x0;
  }
  else {
    local_f0 = (openglfn_glBindTexture_t)(*SDL20_GL_GetProcAddress)("glBindTexture");
  }
  OpenGLFuncs.glBindTexture = local_f0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_f8 = (openglfn_glEnd_t)0x0;
  }
  else {
    local_f8 = (openglfn_glEnd_t)(*SDL20_GL_GetProcAddress)("glEnd");
  }
  OpenGLFuncs.glEnd = local_f8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_100 = (openglfn_glTexEnvf_t)0x0;
  }
  else {
    local_100 = (openglfn_glTexEnvf_t)(*SDL20_GL_GetProcAddress)("glTexEnvf");
  }
  OpenGLFuncs.glTexEnvf = local_100;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_108 = (openglfn_glTexParameteri_t)0x0;
  }
  else {
    local_108 = (openglfn_glTexParameteri_t)(*SDL20_GL_GetProcAddress)("glTexParameteri");
  }
  OpenGLFuncs.glTexParameteri = local_108;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_110 = (openglfn_glPixelStorei_t)0x0;
  }
  else {
    local_110 = (openglfn_glPixelStorei_t)(*SDL20_GL_GetProcAddress)("glPixelStorei");
  }
  OpenGLFuncs.glPixelStorei = local_110;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_118 = (openglfn_glBlendFunc_t)0x0;
  }
  else {
    local_118 = (openglfn_glBlendFunc_t)(*SDL20_GL_GetProcAddress)("glBlendFunc");
  }
  OpenGLFuncs.glBlendFunc = local_118;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_120 = (openglfn_glColor4f_t)0x0;
  }
  else {
    local_120 = (openglfn_glColor4f_t)(*SDL20_GL_GetProcAddress)("glColor4f");
  }
  OpenGLFuncs.glColor4f = local_120;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_128 = (openglfn_glMatrixMode_t)0x0;
  }
  else {
    local_128 = (openglfn_glMatrixMode_t)(*SDL20_GL_GetProcAddress)("glMatrixMode");
  }
  OpenGLFuncs.glMatrixMode = local_128;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_130 = (openglfn_glLoadIdentity_t)0x0;
  }
  else {
    local_130 = (openglfn_glLoadIdentity_t)(*SDL20_GL_GetProcAddress)("glLoadIdentity");
  }
  OpenGLFuncs.glLoadIdentity = local_130;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_138 = (openglfn_glPushMatrix_t)0x0;
  }
  else {
    local_138 = (openglfn_glPushMatrix_t)(*SDL20_GL_GetProcAddress)("glPushMatrix");
  }
  OpenGLFuncs.glPushMatrix = local_138;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_140 = (openglfn_glOrtho_t)0x0;
  }
  else {
    local_140 = (openglfn_glOrtho_t)(*SDL20_GL_GetProcAddress)("glOrtho");
  }
  OpenGLFuncs.glOrtho = local_140;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_148 = (openglfn_glTexImage2D_t)0x0;
  }
  else {
    local_148 = (openglfn_glTexImage2D_t)(*SDL20_GL_GetProcAddress)("glTexImage2D");
  }
  OpenGLFuncs.glTexImage2D = local_148;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_150 = (openglfn_glTexSubImage2D_t)0x0;
  }
  else {
    local_150 = (openglfn_glTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glTexSubImage2D");
  }
  OpenGLFuncs.glTexSubImage2D = local_150;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_158 = (openglfn_glVertex2i_t)0x0;
  }
  else {
    local_158 = (openglfn_glVertex2i_t)(*SDL20_GL_GetProcAddress)("glVertex2i");
  }
  OpenGLFuncs.glVertex2i = local_158;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_160 = (openglfn_glTexCoord2f_t)0x0;
  }
  else {
    local_160 = (openglfn_glTexCoord2f_t)(*SDL20_GL_GetProcAddress)("glTexCoord2f");
  }
  OpenGLFuncs.glTexCoord2f = local_160;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_168 = (openglfn_glBindRenderbuffer_t)0x0;
  }
  else {
    local_168 = (openglfn_glBindRenderbuffer_t)(*SDL20_GL_GetProcAddress)("glBindRenderbuffer");
  }
  OpenGLFuncs.glBindRenderbuffer = local_168;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_170 = (openglfn_glDeleteRenderbuffers_t)0x0;
  }
  else {
    local_170 = (openglfn_glDeleteRenderbuffers_t)
                (*SDL20_GL_GetProcAddress)("glDeleteRenderbuffers");
  }
  OpenGLFuncs.glDeleteRenderbuffers = local_170;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_178 = (openglfn_glGenRenderbuffers_t)0x0;
  }
  else {
    local_178 = (openglfn_glGenRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glGenRenderbuffers");
  }
  OpenGLFuncs.glGenRenderbuffers = local_178;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_180 = (openglfn_glRenderbufferStorage_t)0x0;
  }
  else {
    local_180 = (openglfn_glRenderbufferStorage_t)
                (*SDL20_GL_GetProcAddress)("glRenderbufferStorage");
  }
  OpenGLFuncs.glRenderbufferStorage = local_180;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_188 = (openglfn_glRenderbufferStorageMultisample_t)0x0;
  }
  else {
    local_188 = (openglfn_glRenderbufferStorageMultisample_t)
                (*SDL20_GL_GetProcAddress)("glRenderbufferStorageMultisample");
  }
  OpenGLFuncs.glRenderbufferStorageMultisample = local_188;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_190 = (openglfn_glGetRenderbufferParameteriv_t)0x0;
  }
  else {
    local_190 = (openglfn_glGetRenderbufferParameteriv_t)
                (*SDL20_GL_GetProcAddress)("glGetRenderbufferParameteriv");
  }
  OpenGLFuncs.glGetRenderbufferParameteriv = local_190;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_198 = (openglfn_glIsFramebuffer_t)0x0;
  }
  else {
    local_198 = (openglfn_glIsFramebuffer_t)(*SDL20_GL_GetProcAddress)("glIsFramebuffer");
  }
  OpenGLFuncs.glIsFramebuffer = local_198;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_1a0 = (openglfn_glBindFramebuffer_t)0x0;
  }
  else {
    local_1a0 = (openglfn_glBindFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBindFramebuffer");
  }
  OpenGLFuncs.glBindFramebuffer = local_1a0;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_1a8 = (openglfn_glDeleteFramebuffers_t)0x0;
  }
  else {
    local_1a8 = (openglfn_glDeleteFramebuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteFramebuffers");
  }
  OpenGLFuncs.glDeleteFramebuffers = local_1a8;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_1b0 = (openglfn_glGenFramebuffers_t)0x0;
  }
  else {
    local_1b0 = (openglfn_glGenFramebuffers_t)(*SDL20_GL_GetProcAddress)("glGenFramebuffers");
  }
  OpenGLFuncs.glGenFramebuffers = local_1b0;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_1b8 = (openglfn_glCheckFramebufferStatus_t)0x0;
  }
  else {
    local_1b8 = (openglfn_glCheckFramebufferStatus_t)
                (*SDL20_GL_GetProcAddress)("glCheckFramebufferStatus");
  }
  OpenGLFuncs.glCheckFramebufferStatus = local_1b8;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_1c0 = (openglfn_glFramebufferRenderbuffer_t)0x0;
  }
  else {
    local_1c0 = (openglfn_glFramebufferRenderbuffer_t)
                (*SDL20_GL_GetProcAddress)("glFramebufferRenderbuffer");
  }
  OpenGLFuncs.glFramebufferRenderbuffer = local_1c0;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_1c8 = (openglfn_glBlitFramebuffer_t)0x0;
  }
  else {
    local_1c8 = (openglfn_glBlitFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBlitFramebuffer");
  }
  OpenGLFuncs.glBlitFramebuffer = local_1c8;
  _minor = (*OpenGLFuncs.glGetString)(0x1f02);
  if ((_minor == (GLubyte *)0x0) ||
     (iVar1 = (*SDL20_sscanf)((char *)_minor,"%d.%d",&local_14,&local_18), iVar1 != 2)) {
    local_18 = 0;
    local_14 = 0;
  }
  OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object =
       (*SDL20_GL_ExtensionSupported)("GL_ARB_framebuffer_object");
  OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two =
       (*SDL20_GL_ExtensionSupported)("GL_ARB_texture_non_power_of_two");
  if (2 < local_14) {
    OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object = SDL_TRUE;
  }
  if (1 < local_14) {
    OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two = SDL_TRUE;
  }
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_1d0 = (openglfn_glGetString_t)0x0;
  }
  else {
    local_1d0 = (openglfn_glGetString_t)(*SDL20_GL_GetProcAddress)("glGetString");
  }
  OpenGLFuncs.glGetString = local_1d0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_1d8 = (openglfn_glGetError_t)0x0;
  }
  else {
    local_1d8 = (openglfn_glGetError_t)(*SDL20_GL_GetProcAddress)("glGetError");
  }
  OpenGLFuncs.glGetError = local_1d8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_1e0 = (openglfn_glClear_t)0x0;
  }
  else {
    local_1e0 = (openglfn_glClear_t)(*SDL20_GL_GetProcAddress)("glClear");
  }
  OpenGLFuncs.glClear = local_1e0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_1e8 = (openglfn_glIsEnabled_t)0x0;
  }
  else {
    local_1e8 = (openglfn_glIsEnabled_t)(*SDL20_GL_GetProcAddress)("glIsEnabled");
  }
  OpenGLFuncs.glIsEnabled = local_1e8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_1f0 = (openglfn_glEnable_t)0x0;
  }
  else {
    local_1f0 = (openglfn_glEnable_t)(*SDL20_GL_GetProcAddress)("glEnable");
  }
  OpenGLFuncs.glEnable = local_1f0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_1f8 = (openglfn_glDisable_t)0x0;
  }
  else {
    local_1f8 = (openglfn_glDisable_t)(*SDL20_GL_GetProcAddress)("glDisable");
  }
  OpenGLFuncs.glDisable = local_1f8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_200 = (openglfn_glGetFloatv_t)0x0;
  }
  else {
    local_200 = (openglfn_glGetFloatv_t)(*SDL20_GL_GetProcAddress)("glGetFloatv");
  }
  OpenGLFuncs.glGetFloatv = local_200;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_208 = (openglfn_glGetIntegerv_t)0x0;
  }
  else {
    local_208 = (openglfn_glGetIntegerv_t)(*SDL20_GL_GetProcAddress)("glGetIntegerv");
  }
  OpenGLFuncs.glGetIntegerv = local_208;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_210 = (openglfn_glClearColor_t)0x0;
  }
  else {
    local_210 = (openglfn_glClearColor_t)(*SDL20_GL_GetProcAddress)("glClearColor");
  }
  OpenGLFuncs.glClearColor = local_210;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_218 = (openglfn_glViewport_t)0x0;
  }
  else {
    local_218 = (openglfn_glViewport_t)(*SDL20_GL_GetProcAddress)("glViewport");
  }
  OpenGLFuncs.glViewport = local_218;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_220 = (openglfn_glScissor_t)0x0;
  }
  else {
    local_220 = (openglfn_glScissor_t)(*SDL20_GL_GetProcAddress)("glScissor");
  }
  OpenGLFuncs.glScissor = local_220;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_228 = (openglfn_glReadPixels_t)0x0;
  }
  else {
    local_228 = (openglfn_glReadPixels_t)(*SDL20_GL_GetProcAddress)("glReadPixels");
  }
  OpenGLFuncs.glReadPixels = local_228;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_230 = (openglfn_glCopyPixels_t)0x0;
  }
  else {
    local_230 = (openglfn_glCopyPixels_t)(*SDL20_GL_GetProcAddress)("glCopyPixels");
  }
  OpenGLFuncs.glCopyPixels = local_230;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_238 = (openglfn_glCopyTexImage1D_t)0x0;
  }
  else {
    local_238 = (openglfn_glCopyTexImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage1D");
  }
  OpenGLFuncs.glCopyTexImage1D = local_238;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_240 = (openglfn_glCopyTexSubImage1D_t)0x0;
  }
  else {
    local_240 = (openglfn_glCopyTexSubImage1D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage1D");
  }
  OpenGLFuncs.glCopyTexSubImage1D = local_240;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_248 = (openglfn_glCopyTexImage2D_t)0x0;
  }
  else {
    local_248 = (openglfn_glCopyTexImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexImage2D");
  }
  OpenGLFuncs.glCopyTexImage2D = local_248;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_250 = (openglfn_glCopyTexSubImage2D_t)0x0;
  }
  else {
    local_250 = (openglfn_glCopyTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage2D");
  }
  OpenGLFuncs.glCopyTexSubImage2D = local_250;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_258 = (openglfn_glCopyTexSubImage3D_t)0x0;
  }
  else {
    local_258 = (openglfn_glCopyTexSubImage3D_t)(*SDL20_GL_GetProcAddress)("glCopyTexSubImage3D");
  }
  OpenGLFuncs.glCopyTexSubImage3D = local_258;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_260 = (openglfn_glDeleteTextures_t)0x0;
  }
  else {
    local_260 = (openglfn_glDeleteTextures_t)(*SDL20_GL_GetProcAddress)("glDeleteTextures");
  }
  OpenGLFuncs.glDeleteTextures = local_260;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_268 = (openglfn_glGenTextures_t)0x0;
  }
  else {
    local_268 = (openglfn_glGenTextures_t)(*SDL20_GL_GetProcAddress)("glGenTextures");
  }
  OpenGLFuncs.glGenTextures = local_268;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_270 = (openglfn_glPopAttrib_t)0x0;
  }
  else {
    local_270 = (openglfn_glPopAttrib_t)(*SDL20_GL_GetProcAddress)("glPopAttrib");
  }
  OpenGLFuncs.glPopAttrib = local_270;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_278 = (openglfn_glPopClientAttrib_t)0x0;
  }
  else {
    local_278 = (openglfn_glPopClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPopClientAttrib");
  }
  OpenGLFuncs.glPopClientAttrib = local_278;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_280 = (openglfn_glPopMatrix_t)0x0;
  }
  else {
    local_280 = (openglfn_glPopMatrix_t)(*SDL20_GL_GetProcAddress)("glPopMatrix");
  }
  OpenGLFuncs.glPopMatrix = local_280;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_288 = (openglfn_glBegin_t)0x0;
  }
  else {
    local_288 = (openglfn_glBegin_t)(*SDL20_GL_GetProcAddress)("glBegin");
  }
  OpenGLFuncs.glBegin = local_288;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_290 = (openglfn_glPushAttrib_t)0x0;
  }
  else {
    local_290 = (openglfn_glPushAttrib_t)(*SDL20_GL_GetProcAddress)("glPushAttrib");
  }
  OpenGLFuncs.glPushAttrib = local_290;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_298 = (openglfn_glPushClientAttrib_t)0x0;
  }
  else {
    local_298 = (openglfn_glPushClientAttrib_t)(*SDL20_GL_GetProcAddress)("glPushClientAttrib");
  }
  OpenGLFuncs.glPushClientAttrib = local_298;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2a0 = (openglfn_glBindTexture_t)0x0;
  }
  else {
    local_2a0 = (openglfn_glBindTexture_t)(*SDL20_GL_GetProcAddress)("glBindTexture");
  }
  OpenGLFuncs.glBindTexture = local_2a0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2a8 = (openglfn_glEnd_t)0x0;
  }
  else {
    local_2a8 = (openglfn_glEnd_t)(*SDL20_GL_GetProcAddress)("glEnd");
  }
  OpenGLFuncs.glEnd = local_2a8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2b0 = (openglfn_glTexEnvf_t)0x0;
  }
  else {
    local_2b0 = (openglfn_glTexEnvf_t)(*SDL20_GL_GetProcAddress)("glTexEnvf");
  }
  OpenGLFuncs.glTexEnvf = local_2b0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2b8 = (openglfn_glTexParameteri_t)0x0;
  }
  else {
    local_2b8 = (openglfn_glTexParameteri_t)(*SDL20_GL_GetProcAddress)("glTexParameteri");
  }
  OpenGLFuncs.glTexParameteri = local_2b8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2c0 = (openglfn_glPixelStorei_t)0x0;
  }
  else {
    local_2c0 = (openglfn_glPixelStorei_t)(*SDL20_GL_GetProcAddress)("glPixelStorei");
  }
  OpenGLFuncs.glPixelStorei = local_2c0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2c8 = (openglfn_glBlendFunc_t)0x0;
  }
  else {
    local_2c8 = (openglfn_glBlendFunc_t)(*SDL20_GL_GetProcAddress)("glBlendFunc");
  }
  OpenGLFuncs.glBlendFunc = local_2c8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2d0 = (openglfn_glColor4f_t)0x0;
  }
  else {
    local_2d0 = (openglfn_glColor4f_t)(*SDL20_GL_GetProcAddress)("glColor4f");
  }
  OpenGLFuncs.glColor4f = local_2d0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2d8 = (openglfn_glMatrixMode_t)0x0;
  }
  else {
    local_2d8 = (openglfn_glMatrixMode_t)(*SDL20_GL_GetProcAddress)("glMatrixMode");
  }
  OpenGLFuncs.glMatrixMode = local_2d8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2e0 = (openglfn_glLoadIdentity_t)0x0;
  }
  else {
    local_2e0 = (openglfn_glLoadIdentity_t)(*SDL20_GL_GetProcAddress)("glLoadIdentity");
  }
  OpenGLFuncs.glLoadIdentity = local_2e0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2e8 = (openglfn_glPushMatrix_t)0x0;
  }
  else {
    local_2e8 = (openglfn_glPushMatrix_t)(*SDL20_GL_GetProcAddress)("glPushMatrix");
  }
  OpenGLFuncs.glPushMatrix = local_2e8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2f0 = (openglfn_glOrtho_t)0x0;
  }
  else {
    local_2f0 = (openglfn_glOrtho_t)(*SDL20_GL_GetProcAddress)("glOrtho");
  }
  OpenGLFuncs.glOrtho = local_2f0;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_2f8 = (openglfn_glTexImage2D_t)0x0;
  }
  else {
    local_2f8 = (openglfn_glTexImage2D_t)(*SDL20_GL_GetProcAddress)("glTexImage2D");
  }
  OpenGLFuncs.glTexImage2D = local_2f8;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_300 = (openglfn_glTexSubImage2D_t)0x0;
  }
  else {
    local_300 = (openglfn_glTexSubImage2D_t)(*SDL20_GL_GetProcAddress)("glTexSubImage2D");
  }
  OpenGLFuncs.glTexSubImage2D = local_300;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_308 = (openglfn_glVertex2i_t)0x0;
  }
  else {
    local_308 = (openglfn_glVertex2i_t)(*SDL20_GL_GetProcAddress)("glVertex2i");
  }
  OpenGLFuncs.glVertex2i = local_308;
  if (OpenGLFuncs.SUPPORTS_Core == SDL_FALSE) {
    local_310 = (openglfn_glTexCoord2f_t)0x0;
  }
  else {
    local_310 = (openglfn_glTexCoord2f_t)(*SDL20_GL_GetProcAddress)("glTexCoord2f");
  }
  OpenGLFuncs.glTexCoord2f = local_310;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_318 = (openglfn_glBindRenderbuffer_t)0x0;
  }
  else {
    local_318 = (openglfn_glBindRenderbuffer_t)(*SDL20_GL_GetProcAddress)("glBindRenderbuffer");
  }
  OpenGLFuncs.glBindRenderbuffer = local_318;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_320 = (openglfn_glDeleteRenderbuffers_t)0x0;
  }
  else {
    local_320 = (openglfn_glDeleteRenderbuffers_t)
                (*SDL20_GL_GetProcAddress)("glDeleteRenderbuffers");
  }
  OpenGLFuncs.glDeleteRenderbuffers = local_320;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_328 = (openglfn_glGenRenderbuffers_t)0x0;
  }
  else {
    local_328 = (openglfn_glGenRenderbuffers_t)(*SDL20_GL_GetProcAddress)("glGenRenderbuffers");
  }
  OpenGLFuncs.glGenRenderbuffers = local_328;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_330 = (openglfn_glRenderbufferStorage_t)0x0;
  }
  else {
    local_330 = (openglfn_glRenderbufferStorage_t)
                (*SDL20_GL_GetProcAddress)("glRenderbufferStorage");
  }
  OpenGLFuncs.glRenderbufferStorage = local_330;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_338 = (openglfn_glRenderbufferStorageMultisample_t)0x0;
  }
  else {
    local_338 = (openglfn_glRenderbufferStorageMultisample_t)
                (*SDL20_GL_GetProcAddress)("glRenderbufferStorageMultisample");
  }
  OpenGLFuncs.glRenderbufferStorageMultisample = local_338;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_340 = (openglfn_glGetRenderbufferParameteriv_t)0x0;
  }
  else {
    local_340 = (openglfn_glGetRenderbufferParameteriv_t)
                (*SDL20_GL_GetProcAddress)("glGetRenderbufferParameteriv");
  }
  OpenGLFuncs.glGetRenderbufferParameteriv = local_340;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_348 = (openglfn_glIsFramebuffer_t)0x0;
  }
  else {
    local_348 = (openglfn_glIsFramebuffer_t)(*SDL20_GL_GetProcAddress)("glIsFramebuffer");
  }
  OpenGLFuncs.glIsFramebuffer = local_348;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_350 = (openglfn_glBindFramebuffer_t)0x0;
  }
  else {
    local_350 = (openglfn_glBindFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBindFramebuffer");
  }
  OpenGLFuncs.glBindFramebuffer = local_350;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_358 = (openglfn_glDeleteFramebuffers_t)0x0;
  }
  else {
    local_358 = (openglfn_glDeleteFramebuffers_t)(*SDL20_GL_GetProcAddress)("glDeleteFramebuffers");
  }
  OpenGLFuncs.glDeleteFramebuffers = local_358;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_360 = (openglfn_glGenFramebuffers_t)0x0;
  }
  else {
    local_360 = (openglfn_glGenFramebuffers_t)(*SDL20_GL_GetProcAddress)("glGenFramebuffers");
  }
  OpenGLFuncs.glGenFramebuffers = local_360;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_368 = (openglfn_glCheckFramebufferStatus_t)0x0;
  }
  else {
    local_368 = (openglfn_glCheckFramebufferStatus_t)
                (*SDL20_GL_GetProcAddress)("glCheckFramebufferStatus");
  }
  OpenGLFuncs.glCheckFramebufferStatus = local_368;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_370 = (openglfn_glFramebufferRenderbuffer_t)0x0;
  }
  else {
    local_370 = (openglfn_glFramebufferRenderbuffer_t)
                (*SDL20_GL_GetProcAddress)("glFramebufferRenderbuffer");
  }
  OpenGLFuncs.glFramebufferRenderbuffer = local_370;
  if (OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object == SDL_FALSE) {
    local_378 = (openglfn_glBlitFramebuffer_t)0x0;
  }
  else {
    local_378 = (openglfn_glBlitFramebuffer_t)(*SDL20_GL_GetProcAddress)("glBlitFramebuffer");
  }
  OpenGLFuncs.glBlitFramebuffer = local_378;
  return;
}

Assistant:

static void
LoadOpenGLFunctions(void)
{
    const char *version;
    int major = 0, minor = 0;

    /* load core functions so we can guess about a few other things. */
    SDL20_zero(OpenGLFuncs);
    OpenGLFuncs.SUPPORTS_Core = SDL_TRUE;
    #define OPENGL_SYM(ext,rc,fn,params,args,ret) OpenGLFuncs.fn = \
           (OpenGLFuncs.SUPPORTS_##ext)? (openglfn_##fn##_t)SDL20_GL_GetProcAddress(#fn) : NULL;
    #include "SDL20_syms.h"

    version = (const char *) OpenGLFuncs.glGetString(GL_VERSION);
    if (!version || (SDL20_sscanf(version, "%d.%d", &major, &minor) != 2)) {
        major = minor = 0;
    }

    /* Lookup reported extensions. */
    #define OPENGL_EXT(name) OpenGLFuncs.SUPPORTS_##name = SDL20_GL_ExtensionSupported(#name);
    #include "SDL20_syms.h"

    /* GL_ARB_framebuffer_object is in core OpenGL 3.0+ with the same entry point names as the extension version. */
    if (major >= 3) {
        OpenGLFuncs.SUPPORTS_GL_ARB_framebuffer_object = SDL_TRUE;
    }

    if (major >= 2) {
        OpenGLFuncs.SUPPORTS_GL_ARB_texture_non_power_of_two = SDL_TRUE;  /* core since 2.0 */
    }

    /* load everything we can. */
    #define OPENGL_SYM(ext,rc,fn,params,args,ret) OpenGLFuncs.fn = \
           (OpenGLFuncs.SUPPORTS_##ext)? (openglfn_##fn##_t)SDL20_GL_GetProcAddress(#fn) : NULL;
    #include "SDL20_syms.h"
}